

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL Js::RecyclableObjectDisplay::GetPropertyWithScriptEnter
               (RecyclableObject *originalInstance,RecyclableObject *instance,PropertyId propertyId,
               Var *value,ScriptContext *scriptContext)

{
  BOOL BVar1;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 local_68 [8];
  EnterScriptObject __enterScriptObject;
  TTModeStackAutoPopper suppressModeAutoPopper;
  
  __enterScriptObject.library = (JavascriptLibrary *)scriptContext->threadContext->TTDLog;
  if (__enterScriptObject.library != (JavascriptLibrary *)0x0) {
    TTD::EventLog::PushMode((EventLog *)__enterScriptObject.library,DebuggerSuppressGetter);
  }
  if (scriptContext->threadContext->isScriptActive == false) {
    __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
    __entryExitRecord.scriptContext = (ScriptContext *)0x0;
    __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
    __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
    auStack_a8 = (undefined1  [8])0x0;
    __entryExitRecord._0_1_ = 0;
    __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
    __entryExitRecord._2_6_ = 0;
    __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
    EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_68,scriptContext,(ScriptEntryExitRecord *)auStack_a8,
               unaff_retaddr,&stack0x00000000,false,false,false);
    ScriptContext::OnScriptStart(scriptContext,false,true);
    EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_68);
    BVar1 = JavascriptOperators::GetProperty
                      (originalInstance,instance,propertyId,value,scriptContext,
                       (PropertyValueInfo *)0x0);
    EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_68);
  }
  else {
    BVar1 = JavascriptOperators::GetProperty
                      (originalInstance,instance,propertyId,value,scriptContext,
                       (PropertyValueInfo *)0x0);
  }
  TTD::TTModeStackAutoPopper::~TTModeStackAutoPopper
            ((TTModeStackAutoPopper *)&__enterScriptObject.library);
  return BVar1;
}

Assistant:

BOOL RecyclableObjectDisplay::GetPropertyWithScriptEnter(RecyclableObject* originalInstance, RecyclableObject* instance, PropertyId propertyId, Var* value, ScriptContext* scriptContext)
    {
        BOOL retValue = FALSE;

#if ENABLE_TTD
        TTD::TTModeStackAutoPopper suppressModeAutoPopper(scriptContext->GetThreadContext()->TTDLog);
        if(scriptContext->GetThreadContext()->IsRuntimeInTTDMode())
        {
            suppressModeAutoPopper.PushModeAndSetToAutoPop(TTD::TTDMode::DebuggerSuppressGetter);
        }
#endif

        if(!scriptContext->GetThreadContext()->IsScriptActive())
        {
            BEGIN_JS_RUNTIME_CALL_EX(scriptContext, false)
            {
                IGNORE_STACKWALK_EXCEPTION(scriptContext);
                retValue = Js::JavascriptOperators::GetProperty(originalInstance, instance, propertyId, value, scriptContext);
            }
            END_JS_RUNTIME_CALL(scriptContext);
        }
        else
        {
            retValue = Js::JavascriptOperators::GetProperty(originalInstance, instance, propertyId, value, scriptContext);
        }

        return retValue;
    }